

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O3

assetsys_error_t
assetsys_file_load(assetsys_t *sys,assetsys_file_t f,int *size,void *buffer,int capacity)

{
  char *__dest;
  assetsys_internal_mount_t *paVar1;
  mz_bool mVar2;
  strpool_internal_entry_t *psVar3;
  FILE *__stream;
  size_t sVar4;
  int *piVar5;
  char *__src;
  int iVar6;
  long lVar7;
  
  if (0 < (long)sys->mounts_count) {
    paVar1 = sys->mounts;
    lVar7 = 0;
    do {
      if ((*(unsigned_long_long *)((long)&paVar1->mounted_as + lVar7) == f.mount) &&
         (*(unsigned_long_long *)((long)&paVar1->path + lVar7) == f.path)) {
        piVar5 = (int *)((long)f.index * 0xc + *(long *)((long)&paVar1->files + lVar7));
        if (*(int *)((long)&paVar1->type + lVar7) == 1) {
          iVar6 = *piVar5;
          if (size != (int *)0x0) {
            *size = iVar6;
          }
          if (capacity < iVar6) {
            return ASSETSYS_ERROR_BUFFER_TOO_SMALL;
          }
          mVar2 = mz_zip_reader_extract_to_mem_no_alloc
                            ((mz_zip_archive *)((long)&(paVar1->zip).m_archive_size + lVar7),
                             piVar5[1],buffer,(long)iVar6,0,(void *)0x0,0);
          return (uint)(mVar2 != 0) * 5 + ASSETSYS_ERROR_FAILED_TO_READ_FILE;
        }
        if (size != (int *)0x0) {
          *size = *piVar5;
        }
        __dest = sys->temp;
        psVar3 = strpool_internal_get_entry
                           (&sys->strpool,*(unsigned_long_long *)((long)&paVar1->path + lVar7));
        strcpy(__dest,psVar3->data + 8);
        __src = "/";
        if (sys->temp[0] == '\0') {
          __src = "";
        }
        strcat(__dest,__src);
        psVar3 = strpool_internal_get_entry(&sys->strpool,sys->collated[piVar5[2]].path);
        strcat(__dest,psVar3->data + (long)*(int *)((long)&paVar1->mount_len + lVar7) + 9);
        __stream = fopen(__dest,"rb");
        if (__stream != (FILE *)0x0) {
          fseek(__stream,0,2);
          lVar7 = ftell(__stream);
          fseek(__stream,0,0);
          iVar6 = (int)lVar7;
          if (size != (int *)0x0) {
            *size = iVar6;
          }
          if (capacity < iVar6) {
            fclose(__stream);
            return ASSETSYS_ERROR_BUFFER_TOO_SMALL;
          }
          sVar4 = fread(buffer,1,(long)iVar6,__stream);
          fclose(__stream);
          return (uint)((int)sVar4 == iVar6) * 5 + ASSETSYS_ERROR_FAILED_TO_READ_FILE;
        }
        return ASSETSYS_ERROR_FAILED_TO_READ_FILE;
      }
      lVar7 = lVar7 + 0x98;
    } while ((long)sys->mounts_count * 0x98 - lVar7 != 0);
  }
  return ASSETSYS_ERROR_INVALID_MOUNT;
}

Assistant:

assetsys_error_t assetsys_file_load( assetsys_t* sys, assetsys_file_t f, int* size, void* buffer, int capacity )
    {
    int mount_index = assetsys_internal_find_mount_index( sys, f.mount, f.path );
    if( mount_index < 0 ) return ASSETSYS_ERROR_INVALID_MOUNT;

    struct assetsys_internal_mount_t* mount = &sys->mounts[ mount_index ];
    struct assetsys_internal_file_t* file = &mount->files[ f.index ];
    if( mount->type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP )
        {
        if( size ) *size = (int) file->size;
        if( file->size > capacity ) return ASSETSYS_ERROR_BUFFER_TOO_SMALL;

        mz_bool result = mz_zip_reader_extract_to_mem_no_alloc( &mount->zip, (mz_uint) file->zip_index, buffer, 
            (size_t) file->size, 0, 0, 0 ); 
        return result ? ASSETSYS_SUCCESS : ASSETSYS_ERROR_FAILED_TO_READ_FILE;
        }
    else
        {
        if( size ) *size = file->size;
        strcpy( sys->temp, assetsys_internal_get_string( sys, mount->path ) );
        strcat( sys->temp, *sys->temp == '\0' ? "" : "/" );
        strcat( sys->temp, assetsys_internal_get_string( sys, 
            sys->collated[ file->collated_index ].path ) + mount->mount_len + 1 );
        FILE* fp = fopen( sys->temp, "rb" );
        if( !fp ) return ASSETSYS_ERROR_FAILED_TO_READ_FILE;
        
        fseek( fp, 0, SEEK_END );
        int file_size = (int) ftell( fp );
        fseek( fp, 0, SEEK_SET );
        if( size ) *size = file_size;

        if( file_size > capacity ) { fclose( fp ); return ASSETSYS_ERROR_BUFFER_TOO_SMALL; }

        int size_read = (int) fread( buffer, 1, (size_t) file_size, fp );
        fclose( fp );
        if( size_read != file_size ) return ASSETSYS_ERROR_FAILED_TO_READ_FILE;

        return ASSETSYS_SUCCESS;
        }
    }